

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

NetPortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetPortHeaderSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,DataTypeSyntax *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  NetPortHeaderSyntax *pNVar11;
  
  pNVar11 = (NetPortHeaderSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NetPortHeaderSyntax *)this->endPtr < pNVar11 + 1) {
    pNVar11 = (NetPortHeaderSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pNVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pNVar11->super_PortHeaderSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pNVar11->super_PortHeaderSyntax).super_SyntaxNode.kind = NetPortHeader;
  (pNVar11->direction).kind = TVar3;
  (pNVar11->direction).field_0x2 = uVar4;
  (pNVar11->direction).numFlags = (NumericTokenFlags)NVar5.raw;
  (pNVar11->direction).rawLen = uVar6;
  (pNVar11->direction).info = pIVar1;
  (pNVar11->netType).kind = TVar7;
  (pNVar11->netType).field_0x2 = uVar8;
  (pNVar11->netType).numFlags = (NumericTokenFlags)NVar9.raw;
  (pNVar11->netType).rawLen = uVar10;
  (pNVar11->netType).info = pIVar2;
  (pNVar11->dataType).ptr = args_2;
  (args_2->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pNVar11;
  return pNVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }